

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void error<String>(char *fmtstr,String *args)

{
  String local_58;
  String local_38;
  String *local_18;
  String *args_local;
  char *fmtstr_local;
  
  local_18 = args;
  args_local = (String *)fmtstr;
  String::String(&local_58,fmtstr);
  format<String>(&local_38,&local_58,local_18);
  error(&local_38);
  String::~String(&local_38);
  String::~String(&local_58);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}